

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O0

void linfdelnum(lindef *lin,objnum objn)

{
  uint uVar1;
  uchar *puVar2;
  uchar *puVar3;
  long lVar4;
  ushort in_SI;
  long in_RDI;
  int curtot;
  uchar *curp;
  int totrem;
  int delcnt;
  uint pg;
  uchar *nxtp;
  int j;
  int tot;
  int pgtot;
  int i;
  mcmon *pgobjn;
  uchar *objp_orig;
  uchar *objp;
  uint pgcnt;
  int in_stack_ffffffffffffff9c;
  int iVar5;
  undefined2 in_stack_ffffffffffffffa4;
  mcmon in_stack_ffffffffffffffa6;
  mcmon mVar6;
  mcmcxdef *in_stack_ffffffffffffffa8;
  int local_4c;
  int local_48;
  uint local_44;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  ushort *local_28;
  uchar *local_18;
  uint local_10;
  
  local_34 = (int)*(undefined8 *)(in_RDI + 0x260);
  if (local_34 != 0) {
    local_28 = (ushort *)(in_RDI + 0x160);
    for (local_10 = (local_34 + -1 >> 10) + 1; local_10 != 0; local_10 = local_10 - 1) {
      puVar2 = mcmlck(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa6);
      iVar5 = local_34;
      if (0x400 < local_34) {
        iVar5 = 0x400;
      }
      local_30 = iVar5;
      local_18 = puVar2;
      for (local_2c = 0; mVar6 = (mcmon)((uint)in_stack_ffffffffffffff9c >> 0x10),
          local_2c < local_30; local_2c = local_2c + 1) {
        uVar1 = osrp2(local_18);
        if (uVar1 == in_SI) {
          local_48 = 1;
          local_38 = local_2c;
          while ((local_38 = local_38 + 1, local_38 < local_30 &&
                 (uVar1 = osrp2(local_18 + (local_38 - local_2c) * 4), uVar1 == in_SI))) {
            local_48 = local_48 + 1;
          }
          if (local_38 < local_30) {
            memmove(local_18,local_18 + (local_48 << 2),(long)((local_30 - local_38) * 4));
          }
          if (local_10 < 2) {
            local_30 = local_30 - local_48;
          }
          else {
            puVar3 = mcmlck(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa6);
            memcpy(puVar2 + (local_30 - local_48) * 4,puVar3,(long)(local_48 << 2));
            mcmunlck((mcmcxdef *)
                     CONCAT26(in_stack_ffffffffffffffa6,CONCAT24(in_stack_ffffffffffffffa4,iVar5)),
                     mVar6);
          }
          local_4c = local_34;
          for (local_44 = 1; local_44 < local_10; local_44 = local_44 + 1) {
            in_stack_ffffffffffffff9c = local_4c;
            if (0x400 < local_4c) {
              in_stack_ffffffffffffff9c = 0x400;
            }
            in_stack_ffffffffffffffa4 = (undefined2)in_stack_ffffffffffffff9c;
            mVar6 = (mcmon)((uint)in_stack_ffffffffffffff9c >> 0x10);
            in_stack_ffffffffffffffa6 = mVar6;
            in_stack_ffffffffffffffa8 = (mcmcxdef *)mcmlck(in_stack_ffffffffffffffa8,mVar6);
            memmove(in_stack_ffffffffffffffa8,
                    (void *)((long)in_stack_ffffffffffffffa8->mcmcxmtb +
                            (long)(local_48 << 2) + -0x30),
                    (long)((CONCAT22(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa4) - local_48
                           ) * 4));
            if (local_44 + 1 < local_10) {
              puVar3 = mcmlck(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa6);
              memcpy((void *)((long)in_stack_ffffffffffffffa8->mcmcxmtb +
                             (long)((CONCAT22(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa4) -
                                    local_48) * 4) + -0x30),puVar3,(long)(local_48 << 2));
              mcmunlck((mcmcxdef *)
                       CONCAT26(in_stack_ffffffffffffffa6,CONCAT24(in_stack_ffffffffffffffa4,iVar5))
                       ,mVar6);
            }
            lVar4 = *(long *)(*(long *)**(undefined8 **)(in_RDI + 0x158) +
                             (long)((int)(uint)*(ushort *)
                                                (*(long *)(*(long *)(in_RDI + 0x158) + 0x30 +
                                                          (long)((int)(uint)local_28[local_44] >> 8)
                                                          * 8) +
                                                (long)(int)(local_28[local_44] & 0xff) * 2) >> 8) *
                             8) +
                    (long)(int)(*(ushort *)
                                 (*(long *)(*(long *)(in_RDI + 0x158) + 0x30 +
                                           (long)((int)(uint)local_28[local_44] >> 8) * 8) +
                                 (long)(int)(local_28[local_44] & 0xff) * 2) & 0xff) * 0x20;
            *(ushort *)(lVar4 + 0x14) = *(ushort *)(lVar4 + 0x14) | 1;
            mcmunlck((mcmcxdef *)
                     CONCAT26(in_stack_ffffffffffffffa6,CONCAT24(in_stack_ffffffffffffffa4,iVar5)),
                     mVar6);
            local_4c = local_4c + -0x400;
          }
          *(long *)(in_RDI + 0x260) = *(long *)(in_RDI + 0x260) - (long)local_48;
        }
        local_18 = local_18 + 4;
      }
      lVar4 = *(long *)(*(long *)**(undefined8 **)(in_RDI + 0x158) +
                       (long)((int)(uint)*(ushort *)
                                          (*(long *)(*(long *)(in_RDI + 0x158) + 0x30 +
                                                    (long)((int)(uint)*local_28 >> 8) * 8) +
                                          (long)(int)(*local_28 & 0xff) * 2) >> 8) * 8) +
              (long)(int)(*(ushort *)
                           (*(long *)(*(long *)(in_RDI + 0x158) + 0x30 +
                                     (long)((int)(uint)*local_28 >> 8) * 8) +
                           (long)(int)(*local_28 & 0xff) * 2) & 0xff) * 0x20;
      *(ushort *)(lVar4 + 0x14) = *(ushort *)(lVar4 + 0x14) | 1;
      mcmunlck((mcmcxdef *)
               CONCAT26(in_stack_ffffffffffffffa6,CONCAT24(in_stack_ffffffffffffffa4,iVar5)),mVar6);
      local_28 = local_28 + 1;
      local_34 = local_34 + -0x400;
    }
  }
  return;
}

Assistant:

void linfdelnum(lindef *lin, objnum objn)
{
#   define  linf ((linfdef *)lin)
    uint    pgcnt;
    uchar  *objp;
    uchar  *objp_orig;
    mcmon  *pgobjn;
    int     i;
    int     pgtot;
    int     tot;

    /* figure the number of pages - if no lines, stop now */
    tot = linf->linfcrec;
    if (tot == 0)
        return;

    /* calculate the number of pages to check */
    pgcnt = 1 + ((tot - 1) >> 10);

    /* scan each page */
    for (pgobjn = linf->linfpg ; pgcnt ; ++pgobjn, --pgcnt, tot -= 1024)
    {
        /* lock the page */
        objp = objp_orig = mcmlck(linf->linfmem, *pgobjn);

        /* figure the number on this page */
        pgtot = (tot > 1024 ? 1024 : tot);

        /* scan each record on this page */
        for (i = 0 ; i < pgtot ; ++i, objp += DBGLINFSIZ)
        {
            int j;
            
            /* check this one */
            if (osrp2(objp) == objn)
            {
                uchar *nxtp;
                uint pg;
                int delcnt;
                int totrem;
                
                /* 
                 *   it matches - delete it, along with any subsequent
                 *   contiguous entries that also match it 
                 */
                for (delcnt = 1, j = i + 1 ; j < pgtot ; ++j, ++delcnt)
                {
                    /* 
                     *   if this one doesn't match, we've found the end of
                     *   the contiguous records for this object 
                     */
                    if (osrp2(objp + (j - i)*DBGLINFSIZ) != objn)
                        break;
                }

                /* close up the gap on this page */
                if (j < pgtot)
                    memmove(objp, objp + delcnt*DBGLINFSIZ,
                            (pgtot - j)*DBGLINFSIZ);

                /* 
                 *   if this isn't the last page, copy the bottom of the
                 *   next page to the gap at the top of this page 
                 */
                if (pgcnt > 1)
                {
                    /* lock the next page */
                    nxtp = mcmlck(linf->linfmem, *(pgobjn + 1));

                    /* 
                     *   copy from the beginning of the next page to the
                     *   end of this page 
                     */
                    memcpy(objp_orig + (pgtot - delcnt)*DBGLINFSIZ,
                           nxtp, delcnt*DBGLINFSIZ);

                    /* done with the page */
                    mcmunlck(linf->linfmem, *(pgobjn + 1));
                }
                else
                {
                    /* 
                     *   this is the last page, so there's no next page to
                     *   copy items from - reduce the count of items on
                     *   this page accordingly 
                     */
                    pgtot -= delcnt;
                }

                /*
                 *   Now rearrange all subsequent pages to accommodate the
                 *   gap we just created 
                 */
                for (totrem = tot, pg = 1 ; pg < pgcnt ;
                     totrem -= 1024, ++pg)
                {
                    uchar *curp;
                    int curtot;

                    /* figure how many we have on this page */
                    curtot = (totrem > 1024 ? 1024 : totrem);
                    
                    /* lock this page */
                    curp = mcmlck(linf->linfmem, *(pgobjn + pg));

                    /* delete from the start of this page */
                    memmove(curp, curp + delcnt*DBGLINFSIZ,
                            (curtot - delcnt)*DBGLINFSIZ);

                    /* if there's another page, copy from it */
                    if (pg + 1 < pgcnt)
                    {
                        /* lock the next page */
                        nxtp = mcmlck(linf->linfmem, *(pgobjn + pg + 1));

                        /* 
                         *   copy from the start of the next page to the
                         *   end of this page 
                         */
                        memcpy(curp + (curtot - delcnt)*DBGLINFSIZ,
                               nxtp, delcnt*DBGLINFSIZ);

                        /* unlock it */
                        mcmunlck(linf->linfmem, *(pgobjn + pg + 1));
                    }

                    /* done with the page - touch it and unlock it */
                    mcmtch(linf->linfmem, *(pgobjn + pg));
                    mcmunlck(linf->linfmem, *(pgobjn + pg));
                }

                /* deduct the removed records from the total */
                linf->linfcrec -= delcnt;
            }
        }

        /* done with the page - touch it and unlock it */
        mcmtch(linf->linfmem, *pgobjn);
        mcmunlck(linf->linfmem, *pgobjn);
    }

#   undef  linf
}